

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O1

void test_bson_array(void)

{
  char cVar1;
  char extraout_AL;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  undefined8 uVar11;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  bson_t *bson;
  char *__buf;
  char *__n;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  size_t sVar15;
  DIR *__dirp;
  dirent *pdVar16;
  FILE *__stream;
  long lVar17;
  uint extraout_EDX;
  char *__dest;
  ulong uVar18;
  char *pcVar19;
  DIR *__s;
  DIR *__name;
  char *pcVar20;
  DIR *pDVar21;
  DIR *__filename;
  undefined8 uVar22;
  DIR *pDVar23;
  undefined1 *unaff_R13;
  char *pcVar24;
  char *pcVar25;
  void *unaff_R15;
  char *__n_00;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  bson_t ochild;
  undefined1 auStack_7098 [8];
  undefined1 auStack_7090 [504];
  ulong uStack_6e98;
  DIR *pDStack_6e90;
  char *pcStack_6e88;
  DIR *pDStack_6e80;
  DIR *pDStack_6e78;
  int iStack_6e6c;
  DIR *pDStack_6e68;
  stat sStack_6e60;
  char acStack_6dd0 [512];
  size_t sStack_6bd0;
  char *pcStack_6bc8;
  DIR *pDStack_6bc0;
  char *pcStack_6bb8;
  code *pcStack_6bb0;
  char *pcStack_6ba8;
  ulong uStack_6ba0;
  char *pcStack_6b98;
  DIR *pDStack_6b90;
  undefined8 *puStack_6b88;
  undefined8 uStack_6b50;
  undefined1 *puStack_6b48;
  undefined1 *puStack_6b40;
  undefined1 auStack_6b30 [8];
  char *pcStack_6b28;
  undefined8 uStack_6b18;
  char *pcStack_6b10;
  undefined8 uStack_6b08;
  undefined8 uStack_6af0;
  DIR aDStack_6a80 [25944];
  char *pcStack_528;
  char *pcStack_520;
  char *pcStack_518;
  char *pcStack_510;
  code *apcStack_508 [2];
  undefined1 auStack_4f8 [116];
  uint uStack_484;
  char acStack_480 [256];
  undefined8 uStack_380;
  char *pcStack_378;
  char *pcStack_370;
  char *pcStack_368;
  char *pcStack_360;
  char *pcStack_358;
  char *pcStack_350;
  undefined8 uStack_348;
  code *pcStack_340;
  char *pcStack_338;
  undefined8 uStack_330;
  char *pcStack_328;
  char *pcStack_320;
  char *pcStack_318;
  char *pcStack_310;
  code *pcStack_308;
  undefined8 uStack_300;
  undefined8 uStack_2f8;
  char *pcStack_2f0;
  char *pcStack_2e8;
  char *pcStack_2e0;
  undefined8 uStack_2d8;
  bson_t *pbStack_2d0;
  char *pcStack_2c8;
  code *pcStack_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  char *pcStack_2a0;
  char *pcStack_298;
  char *pcStack_290;
  char *pcStack_288;
  char *pcStack_280;
  code *pcStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_260;
  undefined1 *puStack_258;
  char *pcStack_250;
  char *pcStack_248;
  code *pcStack_240;
  undefined8 uStack_238;
  ulong uStack_230;
  ulong uStack_228;
  undefined1 *puStack_220;
  char *pcStack_218;
  void *pvStack_210;
  code *pcStack_208;
  uint local_184;
  undefined1 local_180 [4];
  uint local_17c;
  
  pcStack_208 = (code *)0x13c201;
  uVar6 = bcon_new(0,"0","baz",0);
  pcStack_208 = (code *)0x13c209;
  uVar7 = bson_bcon_magic();
  pcVar25 = "foo";
  pcStack_208 = (code *)0x13c22a;
  uVar8 = bcon_new(0,"foo",uVar7,3,uVar6,0);
  pcStack_208 = (code *)0x13c232;
  uVar7 = bson_bcone_magic();
  pcStack_208 = (code *)0x13c252;
  cVar1 = bcon_extract(uVar8,"foo",uVar7,3,local_180,0);
  if (cVar1 == '\0') {
LAB_0013c3d5:
    pcStack_208 = (code *)0x13c3da;
    test_bson_array_cold_1();
LAB_0013c3da:
    pcStack_208 = (code *)0x13c3df;
    test_bson_array_cold_6();
LAB_0013c3df:
    pcStack_208 = (code *)0x13c3e4;
    test_bson_array_cold_5();
LAB_0013c3e4:
    pcStack_208 = (code *)0x13c3e9;
    test_bson_array_cold_2();
  }
  else {
    pcStack_208 = (code *)0x13c26a;
    unaff_R15 = (void *)bson_get_data(local_180);
    pcStack_208 = (code *)0x13c275;
    pcVar25 = (char *)bson_get_data(uVar6);
    if (*(uint *)(uVar6 + 4) == local_17c) {
      pcStack_208 = (code *)0x13c289;
      pvVar9 = (void *)bson_get_data(uVar6);
      pcStack_208 = (code *)0x13c299;
      pvVar10 = (void *)bson_get_data(local_180);
      pcStack_208 = (code *)0x13c2a7;
      iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(uVar6 + 4));
      if (iVar2 == 0) {
        pcStack_208 = (code *)0x13c2b8;
        bson_destroy(local_180);
        pcStack_208 = (code *)0x13c2c0;
        bson_destroy(uVar6);
        pcStack_208 = (code *)0x13c2c8;
        bson_destroy(uVar8);
        return;
      }
    }
    unaff_R13 = local_180;
    pcStack_208 = (code *)0x13c2e9;
    uVar7 = bson_as_canonical_extended_json(unaff_R13);
    pcStack_208 = (code *)0x13c2f6;
    uVar11 = bson_as_canonical_extended_json(uVar6);
    uVar8 = 0xffffffff;
    if (local_17c != 0) {
      uVar18 = 0;
      do {
        if (*(int *)(uVar6 + 4) == (int)uVar18) break;
        if (*(char *)((long)unaff_R15 + uVar18) != pcVar25[uVar18]) {
          uVar8 = uVar18 & 0xffffffff;
          break;
        }
        uVar18 = uVar18 + 1;
      } while (local_17c != (uint)uVar18);
    }
    if ((int)uVar8 == -1) {
      uVar3 = local_17c;
      if (local_17c < *(uint *)(uVar6 + 4)) {
        uVar3 = *(uint *)(uVar6 + 4);
      }
      uVar8 = (ulong)(uVar3 - 1);
    }
    pcStack_208 = (code *)0x13c351;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar8,uVar7,uVar11);
    pcStack_208 = (code *)0x13c369;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar8 = (ulong)uVar3;
    pcStack_208 = (code *)0x13c384;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    local_184 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013c3da;
    unaff_R13 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013c3df;
    uVar8 = (ulong)local_17c;
    pcStack_208 = (code *)0x13c3ae;
    uVar18 = write(uVar3,unaff_R15,uVar8);
    if (uVar18 != uVar8) goto LAB_0013c3e4;
    uVar6 = (ulong)*(uint *)(uVar6 + 4);
    pcStack_208 = (code *)0x13c3c4;
    uVar18 = write(uVar4,pcVar25,uVar6);
    if (uVar18 == uVar6) {
      pcStack_208 = (code *)0x13c3d5;
      test_bson_array_cold_4();
      goto LAB_0013c3d5;
    }
  }
  pcStack_208 = test_inline_array;
  test_bson_array_cold_3();
  pcStack_240 = (code *)0x13c3fe;
  uStack_238 = extraout_RAX;
  uStack_230 = uVar6;
  uStack_228 = uVar8;
  puStack_220 = unaff_R13;
  pcStack_218 = pcVar25;
  pvStack_210 = unaff_R15;
  pcStack_208 = (code *)&stack0xfffffffffffffff8;
  uStack_268 = bson_bcon_magic();
  pcStack_248 = (char *)0x0;
  pcStack_250 = "]";
  puStack_258 = (undefined1 *)0x2;
  uStack_260 = 0xf;
  uStack_270 = 0x13c446;
  uVar7 = bcon_new(0,"foo","[",uStack_268,0xf,1);
  pcStack_240 = (code *)0x13c452;
  uStack_268 = bson_bcone_magic();
  pcStack_248 = (char *)0x0;
  pcStack_250 = "]";
  uStack_260 = 0xf;
  uStack_270 = 0x13c481;
  puStack_258 = (undefined1 *)&uStack_238;
  cVar1 = bcon_extract(uVar7,"foo","[",uStack_268,0xf,(long)&uStack_238 + 4);
  if (cVar1 == '\0') {
    pcStack_240 = (code *)0x13c4b2;
    test_inline_array_cold_1();
LAB_0013c4b2:
    pcStack_240 = (code *)0x13c4b7;
    test_inline_array_cold_2();
  }
  else {
    if (uStack_238._4_4_ != 1) goto LAB_0013c4b2;
    if ((int)uStack_238 == 2) {
      pcStack_240 = (code *)0x13c49e;
      bson_destroy(uVar7);
      return;
    }
  }
  pcStack_240 = test_inline_doc;
  test_inline_array_cold_3();
  pcStack_240 = (code *)0x147feb;
  pcStack_248 = "[";
  pcStack_250 = "foo";
  puStack_258 = (undefined1 *)0x0;
  uStack_260 = 0xf;
  pcStack_278 = (code *)0x13c4cc;
  uStack_270 = extraout_RAX_00;
  uStack_268 = uVar7;
  pcStack_2a0 = (char *)bson_bcon_magic();
  pcStack_280 = (char *)0x0;
  pcStack_288 = "}";
  pcStack_290 = (char *)0x1;
  pcStack_298 = (char *)0xf;
  uStack_2a8 = "a";
  uStack_2b0 = 2;
  uStack_2b8 = 0x13c51f;
  uVar7 = bcon_new(0,"foo","{","b",pcStack_2a0,0xf);
  pcStack_278 = (code *)0x13c52b;
  pcStack_2a0 = (char *)bson_bcone_magic();
  uStack_2b0 = (long)&uStack_270 + 4;
  pcStack_280 = (char *)0x0;
  pcStack_288 = "}";
  pcStack_298 = (char *)0xf;
  uStack_2a8 = "b";
  uStack_2b8 = 0x13c56e;
  pcStack_290 = (char *)&uStack_270;
  cVar1 = bcon_extract(uVar7,"foo","{","a",pcStack_2a0,0xf);
  if (cVar1 == '\0') {
    pcStack_278 = (code *)0x13c59f;
    test_inline_doc_cold_1();
LAB_0013c59f:
    pcStack_278 = (code *)0x13c5a4;
    test_inline_doc_cold_2();
  }
  else {
    if (uStack_270._4_4_ != 1) goto LAB_0013c59f;
    if ((int)uStack_270 == 2) {
      pcStack_278 = (code *)0x13c58b;
      bson_destroy(uVar7);
      return;
    }
  }
  pcStack_278 = test_extract_ctx;
  test_inline_doc_cold_3();
  pcStack_278 = (code *)0x0;
  pcStack_280 = "a";
  pcStack_290 = "{";
  pcStack_298 = "foo";
  pcStack_2a0 = "}";
  pcStack_2c0 = (code *)0x13c5bc;
  pcStack_288 = (char *)uVar7;
  uStack_2f8 = (undefined8 *)bson_bcon_magic();
  pcStack_2c0 = (code *)0x0;
  pcStack_2c8 = (char *)0x3;
  pbStack_2d0 = (bson_t *)0xf;
  pcStack_2e0 = "c";
  pcStack_2e8 = (char *)0x2;
  pcStack_2f0 = (char *)0xf;
  uStack_300 = 0x13c5fe;
  uStack_2d8 = uStack_2f8;
  bson = (bson_t *)bcon_new(0,"a",uStack_2f8,0xf,1,"b");
  pcStack_2c0 = (code *)0x13c60a;
  pcStack_308 = (code *)bson_bcone_magic();
  pbStack_2d0 = (bson_t *)((long)&uStack_2b0 + 4);
  uStack_2f8 = &uStack_2a8;
  pcStack_2c8 = (char *)0x0;
  uStack_2d8 = 0xf;
  pcStack_2e8 = "c";
  pcStack_2f0 = (char *)0x0;
  uStack_300 = 0xf;
  pcStack_310 = "b";
  pcStack_318 = (char *)0x0;
  pcStack_320 = (char *)0x13c656;
  pcStack_2e0 = (char *)pcStack_308;
  test_extract_ctx_helper(bson,3,"a",pcStack_308,0xf,(long)&uStack_2a8 + 4);
  if (uStack_2a8._4_4_ == 1) {
    if ((int)uStack_2a8 != 2) goto LAB_0013c68b;
    if (uStack_2b0._4_4_ == 3) {
      pcStack_2c0 = (code *)0x13c677;
      bson_destroy(bson);
      return;
    }
  }
  else {
    pcStack_2c0 = (code *)0x13c68b;
    test_extract_ctx_cold_1();
LAB_0013c68b:
    pcStack_2c0 = (code *)0x13c690;
    test_extract_ctx_cold_2();
  }
  pcStack_2c0 = test_nested;
  test_extract_ctx_cold_3();
  pcStack_2c0 = (code *)0xf;
  pcStack_2c8 = "a";
  uStack_2d8 = 0;
  pcStack_2e8 = "c";
  pcStack_308 = (code *)0x13c6a8;
  pcStack_2e0 = (char *)((long)&uStack_2a8 + 4);
  pbStack_2d0 = bson;
  uStack_330 = bson_bcon_magic();
  pcStack_310 = (char *)0x0;
  pcStack_318 = "}";
  pcStack_320 = (char *)0xa;
  pcStack_328 = (char *)0xf;
  pcStack_338 = (char *)0x13c6fd;
  uVar7 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_308 = (code *)0x13c709;
  uStack_330 = bson_bcone_magic();
  pcStack_320 = (char *)((long)&uStack_2f8 + 4);
  pcStack_310 = (char *)0x0;
  pcStack_318 = "}";
  pcStack_328 = (char *)0xf;
  pcStack_338 = "bar";
  pcStack_340 = (code *)0x13f9a8;
  uStack_348 = 0x13c745;
  cVar1 = bcon_extract(uVar7,"hello",uStack_330,0,&pcStack_2f0,"foo");
  if (cVar1 == '\0') {
    pcStack_308 = (code *)0x13c785;
    test_nested_cold_1();
LAB_0013c785:
    pcStack_308 = (code *)0x13c78a;
    test_nested_cold_2();
  }
  else {
    pcStack_308 = (code *)0x13c75e;
    iVar2 = strcmp("world",pcStack_2f0);
    if (iVar2 != 0) goto LAB_0013c785;
    if (uStack_2f8._4_4_ == 10) {
      pcStack_308 = (code *)0x13c771;
      bson_destroy(uVar7);
      return;
    }
  }
  pcStack_308 = test_skip;
  test_nested_cold_3();
  pcStack_308 = (code *)0x148ce7;
  pcStack_310 = "bar";
  pcStack_318 = (char *)0x0;
  pcStack_320 = "hello";
  pcStack_328 = "foo";
  pcStack_340 = (code *)0x13c79f;
  uStack_330 = uVar7;
  pcStack_368 = (char *)bson_bcon_magic();
  uStack_348 = 0;
  pcStack_350 = "}";
  pcStack_358 = (char *)0xa;
  pcStack_360 = (char *)0xf;
  pcStack_370 = (char *)0x13c7f2;
  uVar7 = bcon_new(0,"hello","world","foo","{","bar");
  pcStack_340 = (code *)0x13c7fe;
  pcVar25 = (char *)bson_bcone_magic();
  pcVar24 = "}";
  uStack_348 = 0;
  pcStack_350 = "}";
  pcStack_358 = (char *)0x10;
  pcStack_360 = (char *)0x1c;
  pcStack_370 = "bar";
  pcStack_378 = "{";
  uStack_380 = 0x13c83a;
  pcStack_368 = pcVar25;
  cVar1 = bcon_extract(uVar7,"hello",pcVar25,0x1c,2);
  if (cVar1 == '\0') {
    pcStack_340 = (code *)0x13c89c;
    test_skip_cold_1();
  }
  else {
    uStack_348 = 0;
    pcStack_350 = "}";
    pcStack_358 = (char *)0x12;
    pcStack_360 = (char *)0x1c;
    pcStack_370 = "bar";
    pcStack_378 = "{";
    uStack_380 = 0x13c879;
    pcStack_368 = pcVar25;
    cVar1 = bcon_extract(uVar7,"hello",pcVar25,0x1c,2);
    if (cVar1 == '\0') {
      bson_destroy(uVar7);
      return;
    }
  }
  pcStack_340 = test_iter;
  test_skip_cold_2();
  pcStack_340 = (code *)0x14c89e;
  pcStack_350 = "bar";
  pcStack_358 = "}";
  pcStack_368 = "{";
  apcStack_508[0] = (code *)0x13c8be;
  pcStack_360 = pcVar25;
  uStack_348 = uVar7;
  __buf = (char *)bson_bcon_magic();
  __n_00 = "foo";
  apcStack_508[0] = (code *)0x13c8e5;
  __n = (char *)bcon_new(0,"foo",__buf,0xf,10);
  apcStack_508[0] = (code *)0x13c8ed;
  uVar7 = bson_bcone_magic();
  pcVar12 = acStack_480;
  pcVar19 = "foo";
  uVar11 = 0x1d;
  uVar22 = 0;
  apcStack_508[0] = (code *)0x13c90d;
  pcVar20 = __n;
  cVar1 = bcon_extract(__n,"foo",uVar7);
  uVar7 = extraout_XMM1_Qa;
  if (cVar1 == '\0') {
LAB_0013cabc:
    apcStack_508[0] = (code *)0x13cac1;
    test_iter_cold_1();
LAB_0013cac1:
    apcStack_508[0] = (code *)0x13cac6;
    test_iter_cold_2();
LAB_0013cac6:
    apcStack_508[0] = (code *)0x13cacb;
    test_iter_cold_3();
LAB_0013cacb:
    apcStack_508[0] = (code *)0x13cad0;
    test_iter_cold_8();
LAB_0013cad0:
    apcStack_508[0] = (code *)0x13cad5;
    test_iter_cold_7();
  }
  else {
    pcVar20 = acStack_480;
    apcStack_508[0] = (code *)0x13c922;
    iVar2 = bson_iter_type();
    uVar7 = extraout_XMM1_Qa_00;
    if (iVar2 != 0x10) goto LAB_0013cac1;
    pcVar20 = acStack_480;
    apcStack_508[0] = (code *)0x13c938;
    iVar2 = bson_iter_int32();
    uVar7 = extraout_XMM1_Qa_01;
    if (iVar2 != 10) goto LAB_0013cac6;
    uVar22 = 0;
    apcStack_508[0] = (code *)0x13c964;
    __n_00 = (char *)bcon_new(0,"foo",__buf,0x1d,acStack_480);
    apcStack_508[0] = (code *)0x13c96f;
    pcVar25 = (char *)bson_get_data(__n_00);
    apcStack_508[0] = (code *)0x13c97a;
    __buf = (char *)bson_get_data(__n);
    if (*(int *)(__n + 4) == *(int *)(__n_00 + 4)) {
      apcStack_508[0] = (code *)0x13c98e;
      pvVar9 = (void *)bson_get_data(__n);
      apcStack_508[0] = (code *)0x13c999;
      pvVar10 = (void *)bson_get_data(__n_00);
      apcStack_508[0] = (code *)0x13c9a7;
      iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        apcStack_508[0] = (code *)0x13c9b3;
        bson_destroy(__n);
        apcStack_508[0] = (code *)0x13c9bb;
        bson_destroy(__n_00);
        return;
      }
    }
    apcStack_508[0] = (code *)0x13c9d4;
    uVar11 = bson_as_canonical_extended_json(__n_00);
    apcStack_508[0] = (code *)0x13c9e1;
    pcVar12 = (char *)bson_as_canonical_extended_json(__n);
    uVar3 = *(uint *)(__n_00 + 4);
    uVar6 = 0xffffffff;
    if (uVar3 != 0) {
      uVar8 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar8) break;
        if (pcVar25[uVar8] != __buf[uVar8]) {
          uVar6 = uVar8 & 0xffffffff;
          break;
        }
        uVar8 = uVar8 + 1;
      } while (uVar3 != (uint)uVar8);
    }
    if ((int)uVar6 == -1) {
      if (uVar3 < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar6 = (ulong)(uVar3 - 1);
    }
    apcStack_508[0] = (code *)0x13ca3c;
    uVar7 = extraout_XMM1_Qa_02;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar6);
    apcStack_508[0] = (code *)0x13ca54;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar24 = (char *)(ulong)uVar3;
    pcVar20 = "failure.expected.bson";
    pcVar19 = (char *)0x42;
    apcStack_508[0] = (code *)0x13ca6f;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_484 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013cacb;
    if (uVar4 == 0xffffffff) goto LAB_0013cad0;
    pcVar24 = (char *)(ulong)uVar4;
    __n_00 = (char *)(ulong)*(uint *)(__n_00 + 4);
    pcVar20 = (char *)(ulong)uVar3;
    apcStack_508[0] = (code *)0x13ca95;
    pcVar19 = pcVar25;
    pcVar13 = (char *)write(uVar3,pcVar25,(size_t)__n_00);
    if (pcVar13 == __n_00) {
      __n = (char *)(ulong)*(uint *)(__n + 4);
      apcStack_508[0] = (code *)0x13caab;
      pcVar19 = __buf;
      pcVar20 = pcVar24;
      pcVar13 = (char *)write(uVar4,__buf,(size_t)__n);
      if (pcVar13 != __n) goto LAB_0013cada;
      pcVar20 = (char *)(ulong)uStack_484;
      pcVar19 = (char *)(ulong)uVar4;
      apcStack_508[0] = (code *)0x13cabc;
      test_iter_cold_6();
      goto LAB_0013cabc;
    }
  }
  apcStack_508[0] = (code *)0x13cada;
  test_iter_cold_4();
LAB_0013cada:
  apcStack_508[0] = test_extract_ctx_helper;
  test_iter_cold_5();
  puStack_6b40 = auStack_6b30;
  if (extraout_AL != '\0') {
    uStack_6af0 = uVar7;
  }
  puStack_6b88 = (undefined8 *)0x13cb62;
  pcStack_6b28 = pcVar19;
  uStack_6b18 = uVar11;
  pcStack_6b10 = pcVar12;
  uStack_6b08 = uVar22;
  pcStack_528 = __n;
  pcStack_520 = pcVar25;
  pcStack_518 = __buf;
  pcStack_510 = __n_00;
  apcStack_508[0] = (code *)&pcStack_340;
  bcon_extract_ctx_init(aDStack_6a80);
  puStack_6b48 = auStack_4f8;
  uStack_6b50 = 0x3000000010;
  uVar7 = 0x10;
  if (0 < (int)(uint)pcStack_6b28) {
    uVar3 = (uint)pcStack_6b28;
    do {
      puStack_6b88 = (undefined8 *)0x13cbce;
      __s = aDStack_6a80;
      pcVar25 = pcVar20;
      cVar1 = bcon_extract_ctx_va(pcVar20,aDStack_6a80,&uStack_6b50);
      iVar2 = (int)uVar7;
      if (cVar1 == '\0') {
        puStack_6b88 = (undefined8 *)0x13cbe9;
        test_extract_ctx_helper_cold_1();
        pcStack_6bb0 = (code *)0x13cc03;
        __name = __s;
        pcStack_6ba8 = pcVar20;
        uStack_6ba0 = (ulong)uVar3;
        pcStack_6b98 = pcVar24;
        pDStack_6b90 = aDStack_6a80;
        puStack_6b88 = &uStack_6b50;
        pcVar24 = (char *)strlen(pcVar25);
        pcStack_6bb0 = (code *)0x13cc0e;
        pDVar21 = __s;
        sVar14 = strlen((char *)__s);
        if ((int)sVar14 + (int)pcVar24 < 499) {
          pcStack_6bb0 = (code *)0x13cc2a;
          memset(__dest,0,500);
          pcStack_6bb0 = (code *)0x13cc38;
          strncat(__dest,pcVar25,(long)(int)pcVar24);
          pcStack_6bb0 = (code *)0x13cc40;
          sVar15 = strlen(__dest);
          (__dest + sVar15)[0] = '/';
          (__dest + sVar15)[1] = '\0';
          pcStack_6bb0 = (code *)0x13cc54;
          strncat(__dest,(char *)__s,(long)(int)sVar14);
          pcVar25 = __dest;
          do {
            if (*pcVar25 == '\\') {
              *pcVar25 = '/';
            }
            else if (*pcVar25 == '\0') {
              return;
            }
            pcVar25 = pcVar25 + 1;
          } while( true );
        }
        pcStack_6bb0 = collect_tests_from_dir;
        assemble_path_cold_1();
        uVar6 = (ulong)extraout_EDX;
        pDStack_6e78 = (DIR *)0x13cc9e;
        __filename = __name;
        iStack_6e6c = iVar2;
        sStack_6bd0 = sVar14;
        pcStack_6bc8 = pcVar24;
        pDStack_6bc0 = __s;
        pcStack_6bb8 = pcVar25;
        pcStack_6bb0 = (code *)apcStack_508;
        __dirp = opendir((char *)__name);
        pDVar23 = pDVar21;
        pDStack_6e80 = __s;
        if (__dirp == (DIR *)0x0) goto LAB_0013cdc9;
        pDStack_6e78 = (DIR *)0x13ccb2;
        __filename = __dirp;
        pdVar16 = readdir(__dirp);
        if (pdVar16 == (dirent *)0x0) goto LAB_0013cda8;
        pcVar24 = "..";
        pDVar23 = (DIR *)0x147699;
        pDStack_6e68 = pDVar21;
        goto LAB_0013ccd1;
      }
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
LAB_0013cd12:
  pDStack_6e78 = (DIR *)0x13cd25;
  assemble_path((char *)__name,pcVar25,acStack_6dd0);
  pDStack_6e78 = (DIR *)0x13cd32;
  iVar5 = stat(pcVar25,&sStack_6e60);
  if ((iVar5 == 0) && ((sStack_6e60.st_mode & 0xf000) == 0x4000)) {
    pDStack_6e78 = (DIR *)0x13cd60;
    uVar3 = collect_tests_from_dir((char (*) [500])pDStack_6e68,acStack_6dd0,iVar2,iStack_6e6c);
    uVar6 = (ulong)uVar3;
  }
  else {
    pDStack_6e78 = (DIR *)0x13cd73;
    pcVar12 = strstr(pcVar25,".json");
    if (pcVar12 != (char *)0x0) {
      uVar6 = (ulong)(iVar2 + 1);
      pDStack_6e78 = (DIR *)0x13cd94;
      assemble_path((char *)__name,pcVar25,(char *)(pDStack_6e68 + (long)iVar2 * 500));
    }
  }
  pDStack_6e78 = (DIR *)0x13cd9c;
  __filename = __dirp;
  pdVar16 = readdir(__dirp);
  if (pdVar16 == (dirent *)0x0) {
LAB_0013cda8:
    pDStack_6e78 = (DIR *)0x13cdb0;
    closedir(__dirp);
    return;
  }
LAB_0013ccd1:
  iVar2 = (int)uVar6;
  if (iVar2 < iStack_6e6c) {
    do {
      pcVar25 = pdVar16->d_name;
      pDStack_6e78 = (DIR *)0x13ccea;
      iVar5 = strcmp(pcVar25,"..");
      if (iVar5 != 0) {
        pDStack_6e78 = (DIR *)0x13ccf9;
        iVar5 = strcmp(pcVar25,".");
        if (iVar5 != 0) goto LAB_0013cd12;
      }
      pDStack_6e78 = (DIR *)0x13cd05;
      pdVar16 = readdir(__dirp);
      if (pdVar16 == (dirent *)0x0) goto LAB_0013cda8;
    } while( true );
  }
  pDStack_6e78 = (DIR *)0x13cdc9;
  collect_tests_from_dir_cold_1();
  pDStack_6e80 = __dirp;
LAB_0013cdc9:
  pDStack_6e78 = (DIR *)get_bson_from_json_file;
  collect_tests_from_dir_cold_2();
  uStack_6e98 = uVar6;
  pDStack_6e90 = pDVar23;
  pcStack_6e88 = pcVar24;
  pDStack_6e78 = __name;
  __stream = fopen((char *)__filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar14 = ftell(__stream);
    fseek(__stream,0,0);
    if (0 < (long)sVar14) {
      pvVar9 = (void *)bson_malloc0(sVar14);
      sVar15 = fread(pvVar9,1,sVar14,__stream);
      if (sVar15 != sVar14) {
        abort();
      }
      fclose(__stream);
      if (pvVar9 != (void *)0x0) {
        lVar17 = bson_new_from_json(pvVar9,sVar14,auStack_7098);
        if (lVar17 == 0) {
          fprintf(_stderr,"Cannot parse %s: %s\n",__filename,auStack_7090);
          abort();
        }
        bson_free(pvVar9);
      }
    }
  }
  return;
}

Assistant:

static void
test_bson_array (void)
{
   bson_t ochild;
   bson_t *child = BCON_NEW ("0", "baz");
   bson_t *bcon = BCON_NEW ("foo", BCON_ARRAY (child));

   BSON_ASSERT (BCON_EXTRACT (bcon, "foo", BCONE_ARRAY (ochild)));

   bson_eq_bson (&ochild, child);

   bson_destroy (&ochild);
   bson_destroy (child);
   bson_destroy (bcon);
}